

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::sse2::FlatLinearCurveMiIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  Scene *scene;
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  float fVar24;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  int local_1b4;
  RayQueryContext *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float local_184;
  float local_180;
  undefined4 local_17c;
  float local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  RTCFilterFunctionNArguments local_158;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8 [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78 [4];
  float local_68 [4];
  float local_58 [4];
  float local_48 [6];
  
  pSVar7 = context->scene;
  local_a8[0] = line->sharedGeomID;
  uVar17 = (line->v0).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[local_a8[0]].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  p_Var10 = pGVar8[1].intersectionFilterN;
  pfVar1 = (float *)(lVar9 + (ulong)uVar17 * (long)p_Var10);
  local_118 = *pfVar1;
  local_f8 = pfVar1[1];
  local_108 = pfVar1[2];
  local_c8 = pfVar1[3];
  uVar4 = (line->v0).field_0.i[1];
  pfVar1 = (float *)(lVar9 + (ulong)uVar4 * (long)p_Var10);
  fStack_114 = *pfVar1;
  fStack_f4 = pfVar1[1];
  fStack_104 = pfVar1[2];
  fStack_c4 = pfVar1[3];
  uVar5 = (line->v0).field_0.i[2];
  pfVar1 = (float *)(lVar9 + (ulong)uVar5 * (long)p_Var10);
  fStack_110 = *pfVar1;
  fStack_f0 = pfVar1[1];
  fStack_100 = pfVar1[2];
  fStack_c0 = pfVar1[3];
  uVar6 = (line->v0).field_0.i[3];
  pfVar1 = (float *)(lVar9 + (ulong)uVar6 * (long)p_Var10);
  fStack_10c = *pfVar1;
  fStack_ec = pfVar1[1];
  fStack_fc = pfVar1[2];
  fStack_bc = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (ulong)(uVar17 + 1) * (long)p_Var10);
  local_198 = pfVar1[1];
  fVar12 = pfVar1[2];
  pfVar2 = (float *)(lVar9 + (ulong)(uVar4 + 1) * (long)p_Var10);
  fStack_1a4 = *pfVar2;
  fStack_194 = pfVar2[1];
  fVar13 = pfVar2[2];
  lVar3 = lVar9 + (ulong)(uVar5 + 1) * (long)p_Var10;
  fStack_190 = *(float *)(lVar3 + 4);
  lVar9 = lVar9 + (ulong)(uVar6 + 1) * (long)p_Var10;
  fStack_18c = *(float *)(lVar9 + 4);
  local_128 = CONCAT44(fVar13,fVar12);
  local_b8 = -(uint)((line->primIDs).field_0.i[0] == 0xffffffff);
  uStack_b4 = -(uint)((line->primIDs).field_0.i[1] == 0xffffffff);
  uStack_b0 = -(uint)((line->primIDs).field_0.i[2] == 0xffffffff);
  uStack_ac = -(uint)((line->primIDs).field_0.i[3] == 0xffffffff);
  local_a8[1] = local_a8[0];
  local_a8[2] = local_a8[0];
  local_a8[3] = local_a8[0];
  fVar24 = (pre->ray_space).vy.field_0.m128[0];
  fVar28 = (pre->ray_space).vy.field_0.m128[1];
  local_e8 = (pre->ray_space).vy.field_0.m128[2];
  fVar29 = (pre->ray_space).vz.field_0.m128[0];
  fVar35 = (pre->ray_space).vz.field_0.m128[1];
  fVar36 = (pre->ray_space).vz.field_0.m128[2];
  fVar41 = (ray->org).field_0.m128[0];
  local_d8 = (ray->org).field_0.m128[1];
  fVar53 = (ray->org).field_0.m128[2];
  fVar37 = local_f8 - local_d8;
  fVar38 = fStack_f4 - local_d8;
  fVar39 = fStack_f0 - local_d8;
  fVar40 = fStack_ec - local_d8;
  fVar19 = local_108 - fVar53;
  fVar21 = fStack_104 - fVar53;
  fVar22 = fStack_100 - fVar53;
  fVar23 = fStack_fc - fVar53;
  fVar42 = (pre->ray_space).vx.field_0.m128[0];
  fVar44 = (pre->ray_space).vx.field_0.m128[1];
  fVar14 = (pre->ray_space).vx.field_0.m128[2];
  fVar45 = local_118 - fVar41;
  fVar46 = fStack_114 - fVar41;
  fVar47 = fStack_110 - fVar41;
  fVar48 = fStack_10c - fVar41;
  fVar55 = fVar42 * fVar45 + fVar24 * fVar37 + fVar29 * fVar19;
  fVar56 = fVar42 * fVar46 + fVar24 * fVar38 + fVar29 * fVar21;
  fVar57 = fVar42 * fVar47 + fVar24 * fVar39 + fVar29 * fVar22;
  fVar58 = fVar42 * fVar48 + fVar24 * fVar40 + fVar29 * fVar23;
  fVar31 = fVar44 * fVar45 + fVar28 * fVar37 + fVar35 * fVar19;
  fVar32 = fVar44 * fVar46 + fVar28 * fVar38 + fVar35 * fVar21;
  fVar33 = fVar44 * fVar47 + fVar28 * fVar39 + fVar35 * fVar22;
  fVar34 = fVar44 * fVar48 + fVar28 * fVar40 + fVar35 * fVar23;
  local_78[0] = fVar45 * fVar14 + fVar37 * local_e8 + fVar19 * fVar36;
  local_78[1] = fVar46 * fVar14 + fVar38 * local_e8 + fVar21 * fVar36;
  local_78[2] = fVar47 * fVar14 + fVar39 * local_e8 + fVar22 * fVar36;
  local_78[3] = fVar48 * fVar14 + fVar40 * local_e8 + fVar23 * fVar36;
  fVar37 = *pfVar1 - fVar41;
  fVar38 = fStack_1a4 - fVar41;
  fVar39 = fStack_1a0 - fVar41;
  fVar41 = fStack_19c - fVar41;
  fVar19 = local_198 - local_d8;
  fVar21 = fStack_194 - local_d8;
  fVar22 = fStack_190 - local_d8;
  fVar23 = fStack_18c - local_d8;
  fVar49 = fVar12 - fVar53;
  fVar51 = fVar13 - fVar53;
  fVar52 = fStack_120 - fVar53;
  fVar53 = fStack_11c - fVar53;
  fVar40 = (fVar42 * fVar37 + fVar24 * fVar19 + fVar29 * fVar49) - fVar55;
  fVar45 = (fVar42 * fVar38 + fVar24 * fVar21 + fVar29 * fVar51) - fVar56;
  fVar46 = (fVar42 * fVar39 + fVar24 * fVar22 + fVar29 * fVar52) - fVar57;
  fVar42 = (fVar42 * fVar41 + fVar24 * fVar23 + fVar29 * fVar53) - fVar58;
  fVar47 = (fVar44 * fVar37 + fVar28 * fVar19 + fVar35 * fVar49) - fVar31;
  fVar48 = (fVar44 * fVar38 + fVar28 * fVar21 + fVar35 * fVar51) - fVar32;
  fVar43 = (fVar44 * fVar39 + fVar28 * fVar22 + fVar35 * fVar52) - fVar33;
  fVar44 = (fVar44 * fVar41 + fVar28 * fVar23 + fVar35 * fVar53) - fVar34;
  auVar25._0_4_ = fVar47 * fVar47;
  auVar25._4_4_ = fVar48 * fVar48;
  auVar25._8_4_ = fVar43 * fVar43;
  auVar25._12_4_ = fVar44 * fVar44;
  auVar30._0_4_ = fVar40 * fVar40 + auVar25._0_4_;
  auVar30._4_4_ = fVar45 * fVar45 + auVar25._4_4_;
  auVar30._8_4_ = fVar46 * fVar46 + auVar25._8_4_;
  auVar30._12_4_ = fVar42 * fVar42 + auVar25._12_4_;
  auVar26 = rcpps(auVar25,auVar30);
  fVar24 = auVar26._0_4_;
  fVar28 = auVar26._4_4_;
  fVar29 = auVar26._8_4_;
  fVar35 = auVar26._12_4_;
  auVar50._0_4_ =
       (((float)DAT_01feca10 - auVar30._0_4_ * fVar24) * fVar24 + fVar24) *
       (-fVar31 * fVar47 - fVar55 * fVar40);
  auVar50._4_4_ =
       ((DAT_01feca10._4_4_ - auVar30._4_4_ * fVar28) * fVar28 + fVar28) *
       (-fVar32 * fVar48 - fVar56 * fVar45);
  auVar50._8_4_ =
       ((DAT_01feca10._8_4_ - auVar30._8_4_ * fVar29) * fVar29 + fVar29) *
       (-fVar33 * fVar43 - fVar57 * fVar46);
  auVar50._12_4_ =
       ((DAT_01feca10._12_4_ - auVar30._12_4_ * fVar35) * fVar35 + fVar35) *
       (-fVar34 * fVar44 - fVar58 * fVar42);
  auVar26 = minps(auVar50,_DAT_01feca10);
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  local_98 = maxps(auVar26,auVar27);
  fVar24 = local_98._0_4_;
  fVar28 = local_98._4_4_;
  fVar29 = local_98._8_4_;
  fVar54 = local_98._12_4_;
  fVar55 = fVar40 * fVar24 + fVar55;
  fVar56 = fVar45 * fVar28 + fVar56;
  fVar57 = fVar46 * fVar29 + fVar57;
  fVar58 = fVar42 * fVar54 + fVar58;
  fVar31 = fVar47 * fVar24 + fVar31;
  fVar32 = fVar48 * fVar28 + fVar32;
  fVar33 = fVar43 * fVar29 + fVar33;
  fVar34 = fVar44 * fVar54 + fVar34;
  local_78[0] = ((fVar37 * fVar14 + fVar19 * local_e8 + fVar49 * fVar36) - local_78[0]) * fVar24 +
                local_78[0];
  local_78[1] = ((fVar38 * fVar14 + fVar21 * local_e8 + fVar51 * fVar36) - local_78[1]) * fVar28 +
                local_78[1];
  local_78[2] = ((fVar39 * fVar14 + fVar22 * local_e8 + fVar52 * fVar36) - local_78[2]) * fVar29 +
                local_78[2];
  local_78[3] = ((fVar41 * fVar14 + fVar23 * local_e8 + fVar53 * fVar36) - local_78[3]) * fVar54 +
                local_78[3];
  fVar35 = (pfVar1[3] - local_c8) * fVar24 + local_c8;
  fVar36 = (pfVar2[3] - fStack_c4) * fVar28 + fStack_c4;
  fVar41 = (*(float *)(lVar3 + 0xc) - fStack_c0) * fVar29 + fStack_c0;
  fVar53 = (*(float *)(lVar9 + 0xc) - fStack_bc) * fVar54 + fStack_bc;
  fVar24 = ray->tfar;
  fVar28 = (ray->org).field_0.m128[3];
  fVar29 = pre->depth_scale;
  auVar26._0_4_ =
       -(uint)((fVar35 + fVar35) * fVar29 < local_78[0]) &
       ~local_b8 & -(uint)(local_78[0] <= fVar24 && fVar28 <= local_78[0]) &
       -(uint)(fVar55 * fVar55 + fVar31 * fVar31 <= fVar35 * fVar35);
  auVar26._4_4_ =
       -(uint)((fVar36 + fVar36) * fVar29 < local_78[1]) &
       ~uStack_b4 & -(uint)(local_78[1] <= fVar24 && fVar28 <= local_78[1]) &
       -(uint)(fVar56 * fVar56 + fVar32 * fVar32 <= fVar36 * fVar36);
  auVar26._8_4_ =
       -(uint)((fVar41 + fVar41) * fVar29 < local_78[2]) &
       ~uStack_b0 & -(uint)(local_78[2] <= fVar24 && fVar28 <= local_78[2]) &
       -(uint)(fVar57 * fVar57 + fVar33 * fVar33 <= fVar41 * fVar41);
  auVar26._12_4_ =
       -(uint)((fVar53 + fVar53) * fVar29 < local_78[3]) &
       ~uStack_ac & -(uint)(local_78[3] <= fVar24 && fVar28 <= local_78[3]) &
       -(uint)(fVar58 * fVar58 + fVar34 * fVar34 <= fVar53 * fVar53);
  iVar16 = movmskps(local_a8[0],auVar26);
  if (iVar16 != 0) {
    local_68[0] = *pfVar1 - local_118;
    auVar20._0_4_ =
         auVar26._0_4_ &
         -(uint)(fVar12 - local_108 != 0.0 || (local_198 - local_f8 != 0.0 || local_68[0] != 0.0));
    auVar20._4_4_ =
         auVar26._4_4_ &
         -(uint)(fVar13 - fStack_104 != 0.0 ||
                (fStack_194 - fStack_f4 != 0.0 || fStack_1a4 - fStack_114 != 0.0));
    auVar20._8_4_ =
         auVar26._8_4_ &
         -(uint)(fStack_120 - fStack_100 != 0.0 ||
                (fStack_190 - fStack_f0 != 0.0 || fStack_1a0 - fStack_110 != 0.0));
    auVar20._12_4_ =
         auVar26._12_4_ &
         -(uint)(fStack_11c - fStack_fc != 0.0 ||
                (fStack_18c - fStack_ec != 0.0 || fStack_19c - fStack_10c != 0.0));
    uVar17 = movmskps(iVar16,auVar20);
    if (uVar17 != 0) {
      local_88 = ZEXT816(0);
      local_68[1] = fStack_1a4 - fStack_114;
      local_68[2] = fStack_1a0 - fStack_110;
      local_68[3] = fStack_19c - fStack_10c;
      local_58[0] = local_198 - local_f8;
      local_58[1] = fStack_194 - fStack_f4;
      local_58[2] = fStack_190 - fStack_f0;
      local_58[3] = fStack_18c - fStack_ec;
      local_48[0] = fVar12 - local_108;
      local_48[1] = fVar13 - fStack_104;
      local_48[2] = fStack_120 - fStack_100;
      local_48[3] = fStack_11c - fStack_fc;
      uVar18 = (ulong)(uVar17 & 0xff);
      local_1b0 = context;
      fStack_e4 = local_e8;
      fStack_e0 = local_e8;
      fStack_dc = local_e8;
      fStack_d4 = local_d8;
      fStack_d0 = local_d8;
      fStack_cc = local_d8;
      do {
        local_158.valid = &local_1b4;
        local_158.hit = (RTCHitN *)&local_188;
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        local_170 = local_a8[uVar11];
        pGVar8 = (pSVar7->geometries).items[local_170].ptr;
        if ((pGVar8->mask & ray->mask) == 0) {
LAB_00af72f1:
          uVar18 = uVar18 ^ 1L << (uVar11 & 0x3f);
          bVar15 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_17c = *(undefined4 *)(local_98 + uVar11 * 4);
            local_178 = local_78[uVar11 - 4];
            local_174 = (line->primIDs).field_0.i[uVar11];
            local_188 = local_68[uVar11];
            local_184 = local_58[uVar11];
            local_180 = local_48[uVar11];
            local_16c = context->user->instID[0];
            local_168 = context->user->instPrimID[0];
            local_1a8 = ray->tfar;
            ray->tfar = local_78[uVar11];
            local_1b4 = -1;
            local_158.geometryUserPtr = pGVar8->userPtr;
            local_158.context = context->user;
            local_158.N = 1;
            local_158.ray = (RTCRayN *)ray;
            if ((pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar8->occlusionFilterN)(&local_158), context = local_1b0, *local_158.valid == 0)
               ) {
LAB_00af7437:
              ray->tfar = local_1a8;
              goto LAB_00af72f1;
            }
            p_Var10 = context->args->filter;
            if (p_Var10 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var10)(&local_158);
                context = local_1b0;
              }
              if (*local_158.valid == 0) goto LAB_00af7437;
            }
          }
          bVar15 = 0;
        }
        if ((bVar15 == 0) || (uVar18 == 0)) {
          return (bool)(bVar15 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }